

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase146::run(TestCase146 *this)

{
  void **this_00;
  Reader reader;
  char cVar1;
  bool bVar2;
  TransformPromiseNodeBase *this_01;
  size_t __n;
  char *pcVar3;
  undefined7 uVar4;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  int __flags;
  ReaderOptions receiveOptions;
  bool disconnected;
  int reverseCallCount;
  int callCount;
  int local_5cc;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  request;
  Promise<void> disconnectPromise;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  RpcSystem<capnp::rpc::twoparty::VatId> rpcClient;
  int handleCount;
  Client client;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  pipelineRequest;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> promise;
  PipeThread serverThread;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> pipelinePromise;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  AsyncIoContext ioContext;
  Maybe<capnp::MessageSize> local_240;
  Maybe<capnp::MessageSize> local_228;
  Maybe<capnp::MessageSize> local_210;
  Maybe<capnp::MessageSize> local_1f8;
  Maybe<capnp::MessageSize> local_1e0;
  Maybe<capnp::MessageSize> local_1c8;
  TwoPartyVatNetwork network;
  
  kj::setupAsyncIo();
  callCount = 0;
  handleCount = 0;
  reverseCallCount = 0;
  runServer(&serverThread,ioContext.provider.ptr,&callCount,&handleCount);
  __flags = 0x40;
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  __n = 0x800000;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&network,serverThread.pipe.ptr,CLIENT,receiveOptions);
  makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&rpcClient,&network.super_TwoPartyVatNetworkBase);
  disconnected = false;
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&request);
  this_01 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_01,(Own<kj::_::PromiseNode> *)&request,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:157:69),_kj::_::PropagateException>
             ::anon_class_8_1_ce360c39_for_func::operator());
  (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0065fd10;
  this_01[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&disconnected;
  response.super_Reader._reader.segment =
       (SegmentReader *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase146::run()::$_0,kj::_::PropagateException>>
        ::instance;
  response.super_Reader._reader.capTable = (CapTableReader *)0x0;
  disconnectPromise.super_PromiseBase.node.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase146::run()::$_0,kj::_::PropagateException>>
        ::instance;
  response2.super_Reader._reader._0_16_ = ZEXT816(0x65fd68);
  disconnectPromise.super_PromiseBase.node.ptr = (PromiseNode *)this_01;
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&response2);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&response);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&request);
  getPersistentCap((RpcSystem<capnp::rpc::twoparty::VatId> *)&response,(Side)&rpcClient,
                   TEST_PIPELINE);
  Capability::Client::castAs<capnproto_test::capnp::test::TestPipeline>(&client,(Client *)&response)
  ;
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&response);
  local_1c8.ptr.isSet = false;
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest(&request,&client,&local_1c8);
  *(undefined4 *)request.super_Builder._builder.data = 0xea;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&response2,&reverseCallCount);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)&response,(Own<capnp::_::TestInterfaceImpl> *)&response2);
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Builder::setInCap
            (&request.super_Builder,(Client *)&response);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)&response.super_Reader._reader.capTable);
  kj::Own<capnp::_::TestInterfaceImpl>::dispose((Own<capnp::_::TestInterfaceImpl> *)&response2);
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)&promise,(int)&request,__buf,__n,__flags);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            ((Pipeline *)&response,&promise.super_Pipeline);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&response2,(Pipeline *)&response);
  local_1e0.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&pipelineRequest,(Client *)&response2,&local_1e0);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)&response2.super_Reader._reader.capTable);
  AnyPointer::Pipeline::~Pipeline((Pipeline *)&response);
  *(undefined4 *)pipelineRequest.super_Builder._builder.data = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&pipelinePromise,(int)&pipelineRequest,__buf_00,__n,__flags);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            ((Pipeline *)&response,&promise.super_Pipeline);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&pipelinePromise2,(Pipeline *)&response);
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            ((Client *)&response2,
             (Client *)
             ((long)&pipelinePromise2.
                     super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
                     super_PromiseBase.node.disposer +
             (long)pipelinePromise2.
                   super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
                   super_PromiseBase.node.disposer[-3]._vptr_Disposer));
  local_1f8.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            (&pipelineRequest2,(Client *)&response2,&local_1f8);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)&response2.super_Reader._reader.capTable);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)
             &pipelinePromise2.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
              super_PromiseBase.node.ptr);
  AnyPointer::Pipeline::~Pipeline((Pipeline *)&response);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
          *)&pipelinePromise2,(int)&pipelineRequest2,__buf_01,__n,__flags);
  response.super_Reader._reader.dataSize = 0;
  response.super_Reader._reader.pointerCount = 0;
  response.super_Reader._reader._38_2_ = 0;
  response.super_Reader._reader.nestingLimit = 0;
  response.super_Reader._reader._44_4_ = 0;
  response.super_Reader._reader.data = (void *)0x0;
  response.super_Reader._reader.pointers = (WirePointer *)0x0;
  response.super_Reader._reader.segment = (SegmentReader *)0x0;
  response.super_Reader._reader.capTable = (CapTableReader *)0x0;
  response.hook.disposer = (Disposer *)0x0;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::operator=
            (&promise,(RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)
                      &response);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)&response);
  pcVar3 = (char *)CONCAT71((int7)(__n >> 8),callCount != 0);
  if (callCount != 0 && kj::_::Debug::minSeverity < 3) {
    response.super_Reader._reader.segment =
         (SegmentReader *)((ulong)response.super_Reader._reader.segment & 0xffffffff00000000);
    pcVar3 = "\"failed: expected \" \"(0) == (callCount)\", 0, callCount";
    __flags = 0x4c8271;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xb6,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response,&callCount);
  }
  if ((reverseCallCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    response.super_Reader._reader.segment =
         (SegmentReader *)((ulong)response.super_Reader._reader.segment & 0xffffffff00000000);
    pcVar3 = "\"failed: expected \" \"(0) == (reverseCallCount)\", 0, reverseCallCount";
    __flags = 0x4fcd6b;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xb7,ERROR,
               "\"failed: expected \" \"(0) == (reverseCallCount)\", 0, reverseCallCount",
               (char (*) [43])"failed: expected (0) == (reverseCallCount)",(int *)&response,
               &reverseCallCount);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &response,&pipelinePromise);
  response2.super_Reader._reader._0_16_ =
       capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX(&response.super_Reader);
  bVar2 = kj::operator==("bar",(StringPtr *)&response2);
  uVar4 = (undefined7)((ulong)pcVar3 >> 8);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    response2.super_Reader._reader._0_16_ =
         capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                   (&response.super_Reader);
    uVar4 = 0x4c85;
    __flags = 0x4c863a;
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xba,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response.getX())\", \"bar\", response.getX()"
               ,(char (*) [46])"failed: expected (\"bar\") == (response.getX())",
               (char (*) [4])0x501447,(Reader *)&response2);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)&response2,
             &pipelinePromise2);
  reader._reader.data = response2.super_Reader._reader.data;
  reader._reader.segment = response2.super_Reader._reader.segment;
  reader._reader.capTable = response2.super_Reader._reader.capTable;
  reader._reader.pointers = response2.super_Reader._reader.pointers;
  reader._reader.dataSize = response2.super_Reader._reader.dataSize;
  reader._reader.pointerCount = response2.super_Reader._reader.pointerCount;
  reader._reader._38_2_ = response2.super_Reader._reader._38_2_;
  reader._reader.nestingLimit = response2.super_Reader._reader.nestingLimit;
  reader._reader._44_4_ = response2.super_Reader._reader._44_4_;
  checkTestMessage(reader);
  pcVar3 = (char *)CONCAT71(uVar4,callCount != 3);
  if (callCount != 3 && kj::_::Debug::minSeverity < 3) {
    local_5cc = 3;
    pcVar3 = "\"failed: expected \" \"(3) == (callCount)\", 3, callCount";
    __flags = 0x4c869f;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xbf,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",&local_5cc,&callCount);
  }
  if ((reverseCallCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_5cc = 1;
    pcVar3 = "\"failed: expected \" \"(1) == (reverseCallCount)\", 1, reverseCallCount";
    __flags = 0x4fcddb;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xc0,ERROR,
               "\"failed: expected \" \"(1) == (reverseCallCount)\", 1, reverseCallCount",
               (char (*) [43])"failed: expected (1) == (reverseCallCount)",&local_5cc,
               &reverseCallCount);
  }
  kj::Own<capnp::ResponseHook>::dispose(&response2.hook);
  kj::Own<capnp::ResponseHook>::dispose(&response.hook);
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise(&pipelinePromise2);
  kj::Own<capnp::RequestHook>::dispose(&pipelineRequest2.hook);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            (&pipelinePromise);
  kj::Own<capnp::RequestHook>::dispose(&pipelineRequest.hook);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise(&promise);
  kj::Own<capnp::RequestHook>::dispose(&request.hook);
  if ((disconnected == true) && (kj::_::Debug::minSeverity < 3)) {
    pcVar3 = "\"failed: expected \" \"!(disconnected)\"";
    __flags = 0x4fce2c;
    kj::_::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xc3,ERROR,"\"failed: expected \" \"!(disconnected)\"",
               (char (*) [33])"failed: expected !(disconnected)");
  }
  (*((serverThread.pipe.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[4])();
  kj::Promise<void>::wait(&disconnectPromise,ioContext.waitScope);
  local_210.ptr.isSet = false;
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest
            ((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
              *)&response2,&client,&local_210);
  *(undefined4 *)response2.super_Reader._reader.data = 0xea;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&request,&reverseCallCount);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)&response,(Own<capnp::_::TestInterfaceImpl> *)&request);
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Builder::setInCap
            ((Builder *)&response2,(Client *)&response);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)&response.super_Reader._reader.capTable);
  kj::Own<capnp::_::TestInterfaceImpl>::dispose((Own<capnp::_::TestInterfaceImpl> *)&request);
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send(&request,(int)&response2,__buf_02,(size_t)pcVar3,__flags);
  this_00 = &request.super_Builder._builder.data;
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            ((Pipeline *)&response,(Pipeline *)this_00);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&pipelineRequest,(Pipeline *)&response);
  local_228.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)&promise,(Client *)&pipelineRequest,&local_228);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)&pipelineRequest.super_Builder._builder.capTable);
  AnyPointer::Pipeline::~Pipeline((Pipeline *)&response);
  *(undefined4 *)&(promise.super_Pipeline._typeless.hook.disposer)->_vptr_Disposer = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&pipelineRequest,(int)&promise,__buf_03,(size_t)pcVar3,__flags);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::getOutBox
            ((Pipeline *)&response,(Pipeline *)this_00);
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap
            ((Client *)&pipelinePromise2,(Pipeline *)&response);
  Capability::Client::castAs<capnproto_test::capnp::test::TestExtends>
            ((Client *)&pipelineRequest2,
             (Client *)
             ((long)&pipelinePromise2.
                     super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
                     super_PromiseBase.node.disposer +
             (long)pipelinePromise2.
                   super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
                   super_PromiseBase.node.disposer[-3]._vptr_Disposer));
  local_240.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            ((Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
              *)&pipelinePromise,(Client *)&pipelineRequest2,&local_240);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)&pipelineRequest2.super_Builder._builder.capTable);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)
             &pipelinePromise2.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
              super_PromiseBase.node.ptr);
  AnyPointer::Pipeline::~Pipeline((Pipeline *)&response);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send(&pipelineRequest2,(int)&pipelinePromise,__buf_04,(size_t)pcVar3,__flags);
  pipelinePromise2.super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
  super_PromiseBase.node.disposer = (Disposer *)&PTR_run_0065fd98;
  pipelinePromise2.super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
  super_PromiseBase.node.ptr = (PromiseNode *)&pipelineRequest;
  pipelinePromise2.super_Pipeline._typeless.hook.disposer = (Disposer *)&ioContext;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&response,(Runnable *)&pipelinePromise2);
  cVar1 = (char)response.super_Reader._reader.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&response);
  if ((cVar1 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[110]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xdb,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { pipelinePromise.wait(ioContext.waitScope); }) != nullptr\""
               ,(char (*) [110])
                "failed: expected ::kj::runCatchingExceptions([&]() { pipelinePromise.wait(ioContext.waitScope); }) != nullptr"
              );
  }
  pipelinePromise2.super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
  super_PromiseBase.node.disposer = (Disposer *)&PTR_run_0065fdc8;
  pipelinePromise2.super_Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>.
  super_PromiseBase.node.ptr = (PromiseNode *)&pipelineRequest2;
  pipelinePromise2.super_Pipeline._typeless.hook.disposer = (Disposer *)&ioContext;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&response,(Runnable *)&pipelinePromise2);
  cVar1 = (char)response.super_Reader._reader.segment;
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&response);
  if (kj::_::Debug::minSeverity < 3 && cVar1 == '\0') {
    kj::_::Debug::log<char_const(&)[111]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xdc,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { pipelinePromise2.wait(ioContext.waitScope); }) != nullptr\""
               ,(char (*) [111])
                "failed: expected ::kj::runCatchingExceptions([&]() { pipelinePromise2.wait(ioContext.waitScope); }) != nullptr"
              );
  }
  if (kj::_::Debug::minSeverity < 3 && callCount != 3) {
    response.super_Reader._reader.segment =
         (SegmentReader *)CONCAT44(response.super_Reader._reader.segment._4_4_,3);
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xde,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",(int *)&response,&callCount);
  }
  if ((reverseCallCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    response.super_Reader._reader.segment =
         (SegmentReader *)CONCAT44(response.super_Reader._reader.segment._4_4_,1);
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xdf,ERROR,
               "\"failed: expected \" \"(1) == (reverseCallCount)\", 1, reverseCallCount",
               (char (*) [43])"failed: expected (1) == (reverseCallCount)",(int *)&response,
               &reverseCallCount);
  }
  RemotePromise<capnproto_test::capnp::test::TestAllTypes>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestAllTypes> *)&pipelineRequest2);
  kj::Own<capnp::RequestHook>::dispose
            ((Own<capnp::RequestHook> *)&pipelinePromise.super_Pipeline._typeless.ops.size_);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)
             &pipelineRequest);
  kj::Own<capnp::RequestHook>::dispose
            ((Own<capnp::RequestHook> *)&promise.super_Pipeline._typeless.ops.size_);
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)&request);
  kj::Own<capnp::RequestHook>::dispose
            ((Own<capnp::RequestHook> *)&response2.super_Reader._reader.nestingLimit);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client.field_0x8);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&disconnectPromise);
  RpcSystemBase::~RpcSystemBase(&rpcClient.super_RpcSystemBase);
  TwoPartyVatNetwork::~TwoPartyVatNetwork(&network);
  kj::AsyncIoProvider::PipeThread::~PipeThread(&serverThread);
  kj::AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(TwoPartyNetwork, Pipelining) {
  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;
  int reverseCallCount = 0;  // Calls back from server to client.

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);
  auto rpcClient = makeRpcClient(network);

  bool disconnected = false;
  kj::Promise<void> disconnectPromise = network.onDisconnect().then([&]() { disconnected = true; });

  {
    // Request the particular capability from the server.
    auto client = getPersistentCap(rpcClient, rpc::twoparty::Side::SERVER,
        test::TestSturdyRefObjectId::Tag::TEST_PIPELINE).castAs<test::TestPipeline>();

    {
      // Use the capability.
      auto request = client.getCapRequest();
      request.setN(234);
      request.setInCap(kj::heap<TestInterfaceImpl>(reverseCallCount));

      auto promise = request.send();

      auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
      pipelineRequest.setI(321);
      auto pipelinePromise = pipelineRequest.send();

      auto pipelineRequest2 = promise.getOutBox().getCap()
          .castAs<test::TestExtends>().graultRequest();
      auto pipelinePromise2 = pipelineRequest2.send();

      promise = nullptr;  // Just to be annoying, drop the original promise.

      EXPECT_EQ(0, callCount);
      EXPECT_EQ(0, reverseCallCount);

      auto response = pipelinePromise.wait(ioContext.waitScope);
      EXPECT_EQ("bar", response.getX());

      auto response2 = pipelinePromise2.wait(ioContext.waitScope);
      checkTestMessage(response2);

      EXPECT_EQ(3, callCount);
      EXPECT_EQ(1, reverseCallCount);
    }

    EXPECT_FALSE(disconnected);

    // What if we disconnect?
    serverThread.pipe->shutdownWrite();

    // The other side should also disconnect.
    disconnectPromise.wait(ioContext.waitScope);

    {
      // Use the now-broken capability.
      auto request = client.getCapRequest();
      request.setN(234);
      request.setInCap(kj::heap<TestInterfaceImpl>(reverseCallCount));

      auto promise = request.send();

      auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
      pipelineRequest.setI(321);
      auto pipelinePromise = pipelineRequest.send();

      auto pipelineRequest2 = promise.getOutBox().getCap()
          .castAs<test::TestExtends>().graultRequest();
      auto pipelinePromise2 = pipelineRequest2.send();

      EXPECT_ANY_THROW(pipelinePromise.wait(ioContext.waitScope));
      EXPECT_ANY_THROW(pipelinePromise2.wait(ioContext.waitScope));

      EXPECT_EQ(3, callCount);
      EXPECT_EQ(1, reverseCallCount);
    }
  }
}